

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Designator_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Designator_PDU::Designator_PDU(Designator_PDU *this,KDataStream *stream)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Designator_PDU_002214a8;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_DesignatingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_DesignatedEntityID);
  DATA_TYPE::Vector::Vector(&this->m_SpotRegardsToEntity);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_SpotLocation);
  DATA_TYPE::Vector::Vector(&this->m_EntityLinearAcceleration);
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

Designator_PDU::Designator_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}